

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O1

char * KindToStrIO(NaControlLawKind k)

{
  if (k < __clkNumber) {
    return (&PTR_anon_var_dwarf_2f_00173c60)[k];
  }
  return "?kind?";
}

Assistant:

const char*     KindToStrIO (NaControlLawKind k)
{
    switch(k)
    {
    case clkConstant:
        return "constant";
    case clkMeander:
        return "meander";
    case clkSine:
        return "sine";
    case clkSineSine:
        return "sine_sine";
    case clkPike:
        return "pike";
    default:
        return "?kind?";
    }
}